

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_writer_update_zip64_extension_block
                  (mz_zip_array *pNew_ext,mz_zip_archive *pZip,mz_uint8 *pExt,uint32_t ext_len,
                  mz_uint64 *pComp_size,mz_uint64 *pUncomp_size,mz_uint64 *pLocal_header_ofs,
                  mz_uint32 *pDisk_start)

{
  ulong uVar1;
  mz_bool mVar2;
  size_t sVar3;
  mz_uint64 *pmVar4;
  long lVar5;
  undefined2 local_78;
  short sStack_76;
  mz_uint64 local_74 [8];
  
  if ((pNew_ext->m_capacity < (ulong)(ext_len + 0x40)) &&
     (mVar2 = mz_zip_array_ensure_capacity(pZip,pNew_ext,(ulong)(ext_len + 0x40),0), mVar2 == 0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
LAB_0010c518:
    mVar2 = 0;
  }
  else {
    pNew_ext->m_size = 0;
    if ((pComp_size != (mz_uint64 *)0x0 || pUncomp_size != (mz_uint64 *)0x0) ||
        pLocal_header_ofs != (mz_uint64 *)0x0) {
      if (pUncomp_size == (mz_uint64 *)0x0) {
        pmVar4 = local_74;
      }
      else {
        local_74[0] = *pUncomp_size;
        pmVar4 = local_74 + 1;
      }
      if (pComp_size != (mz_uint64 *)0x0) {
        *pmVar4 = *pComp_size;
        pmVar4 = pmVar4 + 1;
      }
      if (pLocal_header_ofs == (mz_uint64 *)0x0) {
        sVar3 = 0;
      }
      else {
        *pmVar4 = *pLocal_header_ofs;
        pmVar4 = pmVar4 + 1;
        sVar3 = pNew_ext->m_size;
      }
      lVar5 = (long)pmVar4 - (long)&local_78;
      _local_78 = CONCAT22((short)lVar5 + -4,1);
      uVar1 = sVar3 + lVar5;
      if ((pNew_ext->m_capacity < uVar1) &&
         (mVar2 = mz_zip_array_ensure_capacity(pZip,pNew_ext,uVar1,1), mVar2 == 0)) {
        if (pZip != (mz_zip_archive *)0x0) {
          pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
        }
        goto LAB_0010c518;
      }
      pNew_ext->m_size = uVar1;
      memcpy((void *)(sVar3 * pNew_ext->m_element_size + (long)pNew_ext->m_p),&local_78,
             lVar5 * (ulong)pNew_ext->m_element_size);
    }
    mVar2 = 1;
    if (ext_len != 0 && pExt != (mz_uint8 *)0x0) {
      do {
        if (ext_len < 4) {
LAB_0010c4f2:
          if (pZip == (mz_zip_archive *)0x0) {
            return 0;
          }
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          return 0;
        }
        lVar5 = (ulong)*(ushort *)((long)pExt + 2) + 4;
        if (ext_len < (uint)lVar5) goto LAB_0010c4f2;
        if (*(short *)pExt != 1) {
          sVar3 = pNew_ext->m_size;
          uVar1 = sVar3 + lVar5;
          if ((pNew_ext->m_capacity < uVar1) &&
             (mVar2 = mz_zip_array_ensure_capacity(pZip,pNew_ext,uVar1,1), mVar2 == 0)) {
            if (pZip == (mz_zip_archive *)0x0) {
              return 0;
            }
            pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
            return 0;
          }
          pNew_ext->m_size = uVar1;
          memcpy((void *)(sVar3 * pNew_ext->m_element_size + (long)pNew_ext->m_p),pExt,
                 (ulong)pNew_ext->m_element_size * lVar5);
        }
        pExt = (mz_uint8 *)((long)pExt + lVar5);
        ext_len = ext_len - (uint)lVar5;
      } while (ext_len != 0);
      mVar2 = 1;
    }
  }
  return mVar2;
}

Assistant:

static mz_bool mz_zip_writer_update_zip64_extension_block(mz_zip_array *pNew_ext, mz_zip_archive *pZip, const mz_uint8 *pExt, uint32_t ext_len, mz_uint64 *pComp_size, mz_uint64 *pUncomp_size, mz_uint64 *pLocal_header_ofs, mz_uint32 *pDisk_start)
{
    /* + 64 should be enough for any new zip64 data */
    if (!mz_zip_array_reserve(pZip, pNew_ext, ext_len + 64, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    mz_zip_array_resize(pZip, pNew_ext, 0, MZ_FALSE);

    if ((pUncomp_size) || (pComp_size) || (pLocal_header_ofs) || (pDisk_start))
    {
        mz_uint8 new_ext_block[64];
        mz_uint8 *pDst = new_ext_block;
        mz_write_le16(pDst, MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID);
        mz_write_le16(pDst + sizeof(mz_uint16), 0);
        pDst += sizeof(mz_uint16) * 2;

        if (pUncomp_size)
        {
            mz_write_le64(pDst, *pUncomp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pComp_size)
        {
            mz_write_le64(pDst, *pComp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pLocal_header_ofs)
        {
            mz_write_le64(pDst, *pLocal_header_ofs);
            pDst += sizeof(mz_uint64);
        }

        if (pDisk_start)
        {
            mz_write_le32(pDst, *pDisk_start);
            pDst += sizeof(mz_uint32);
        }

        mz_write_le16(new_ext_block + sizeof(mz_uint16), (mz_uint16)((pDst - new_ext_block) - sizeof(mz_uint16) * 2));

        if (!mz_zip_array_push_back(pZip, pNew_ext, new_ext_block, pDst - new_ext_block))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if ((pExt) && (ext_len))
    {
        mz_uint32 extra_size_remaining = ext_len;
        const mz_uint8 *pExtra_data = pExt;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id != MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                if (!mz_zip_array_push_back(pZip, pNew_ext, pExtra_data, field_total_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    return MZ_TRUE;
}